

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O3

void __thiscall Refal2::CVariables::Reset(CVariables *this)

{
  if (this->variables != (CVariable *)0x0) {
    operator_delete(this->variables);
    this->variables = (CVariable *)0x0;
  }
  this->variablesSize = 0;
  if (this->variablesValues != (TTableIndex *)0x0) {
    operator_delete(this->variablesValues);
    this->variablesValues = (TTableIndex *)0x0;
  }
  this->variablesValuesSize = 0;
  return;
}

Assistant:

void CVariables::Reset()
{
	if( variables != 0 ) {
		::operator delete( variables );
		variables = 0;
	}
	variablesSize = 0;

	if( variablesValues != 0 ) {
		::operator delete( variablesValues );
		variablesValues = 0;
	}
	variablesValuesSize = 0;
}